

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseElementStart(xmlParserCtxtPtr ctxt)

{
  int *piVar1;
  xmlChar xVar2;
  xmlType xVar3;
  xmlParserInputPtr pxVar4;
  _xmlNode *p_Var5;
  xmlDocPtr doc;
  xmlChar *pxVar6;
  _xmlSAXHandler *p_Var7;
  uint uVar8;
  xmlChar *value;
  int *piVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  xmlChar *URI;
  xmlChar *prefix;
  int tlen;
  xmlParserNodeInfo node_info;
  xmlChar *local_70;
  xmlChar *local_68;
  int local_5c;
  xmlParserNodeInfo local_58;
  
  local_68 = (xmlChar *)0x0;
  local_70 = (xmlChar *)0x0;
  local_5c = 0;
  iVar12 = ctxt->nsNr;
  if ((xmlParserMaxDepth < (uint)ctxt->nameNr) && ((ctxt->options & 0x80000) == 0)) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_INTERNAL_ERROR,
                      "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
                      xmlParserMaxDepth);
    xmlHaltParser(ctxt);
    return -1;
  }
  if (ctxt->record_info != 0) {
    pxVar4 = ctxt->input;
    local_58.begin_pos = (unsigned_long)(pxVar4->cur + (pxVar4->consumed - (long)pxVar4->base));
    local_58.begin_line = (unsigned_long)pxVar4->line;
  }
  if (ctxt->spaceNr == 0) {
    iVar11 = -1;
  }
  else {
    iVar11 = -1;
    if (*ctxt->space != -2) {
      iVar11 = *ctxt->space;
    }
  }
  spacePush(ctxt,iVar11);
  iVar11 = ctxt->input->line;
  if (ctxt->sax2 == 0) {
    value = xmlParseStartTag(ctxt);
  }
  else {
    value = xmlParseStartTag2(ctxt,&local_68,&local_70,&local_5c);
  }
  iVar10 = -1;
  if (ctxt->instate == XML_PARSER_EOF) {
    return -1;
  }
  if (value == (xmlChar *)0x0) {
    iVar12 = ctxt->spaceNr;
    if ((long)iVar12 < 1) {
      return -1;
    }
    ctxt->spaceNr = iVar12 + -1;
    piVar1 = ctxt->spaceTab + (long)iVar12 + -2;
    piVar9 = ctxt->spaceTab;
    if (iVar12 != 1) {
      piVar9 = piVar1;
    }
    ctxt->space = piVar9;
    piVar1[1] = -1;
    return -1;
  }
  if (ctxt->sax2 == 0) {
    namePush(ctxt,value);
  }
  else {
    nameNsPush(ctxt,value,local_68,local_70,ctxt->nsNr - iVar12);
  }
  p_Var5 = ctxt->node;
  if ((((ctxt->validate != 0) && (ctxt->wellFormed != 0)) &&
      (doc = ctxt->myDoc, p_Var5 != (_xmlNode *)0x0 && doc != (xmlDocPtr)0x0)) &&
     (p_Var5 == doc->children)) {
    uVar8 = xmlValidateRoot(&ctxt->vctxt,doc);
    ctxt->valid = ctxt->valid & uVar8;
  }
  xVar3 = ctxt->mlType;
  if ((((xVar3 == XML_TYPE_XML) && (pxVar6 = ctxt->input->cur, *pxVar6 == '/')) &&
      (pxVar6[1] == '>')) ||
     ((xVar3 == XML_TYPE_SML &&
      (((xVar2 = *ctxt->input->cur, xVar2 == '\n' || (xVar2 == '}')) || (xVar2 == ';')))))) {
    pxVar4 = ctxt->input;
    pxVar6 = pxVar4->cur;
    if (xVar3 == XML_TYPE_XML) {
      pxVar4->cur = pxVar6 + 2;
      pxVar4->col = pxVar4->col + 2;
      xVar2 = pxVar6[2];
joined_r0x00166faf:
      if (xVar2 == '\0') {
        xmlParserInputGrow(pxVar4,0xfa);
      }
    }
    else if (*pxVar6 == ';') {
      pxVar4->cur = pxVar6 + 1;
      pxVar4->col = pxVar4->col + 1;
      xVar2 = pxVar6[1];
      goto joined_r0x00166faf;
    }
    p_Var7 = ctxt->sax;
    if (ctxt->sax2 == 0) {
      if (((p_Var7 != (_xmlSAXHandler *)0x0) && (p_Var7->endElement != (endElementSAXFunc)0x0)) &&
         (ctxt->disableSAX == 0)) {
        (*p_Var7->endElement)(ctxt->userData,value);
      }
    }
    else if (((p_Var7 != (_xmlSAXHandler *)0x0) &&
             (p_Var7->endElementNs != (endElementNsSAX2Func)0x0)) && (ctxt->disableSAX == 0)) {
      (*p_Var7->endElementNs)(ctxt->userData,value,local_68,local_70);
    }
    namePop(ctxt);
    iVar11 = ctxt->spaceNr;
    if (0 < (long)iVar11) {
      ctxt->spaceNr = iVar11 + -1;
      piVar1 = ctxt->spaceTab + (long)iVar11 + -2;
      piVar9 = ctxt->spaceTab;
      if (iVar11 != 1) {
        piVar9 = piVar1;
      }
      ctxt->space = piVar9;
      piVar1[1] = -1;
    }
    iVar12 = ctxt->nsNr - iVar12;
    if (iVar12 != 0) {
      nsPop(ctxt,iVar12);
    }
    iVar10 = 1;
LAB_0016706d:
    if ((p_Var5 != (_xmlNode *)0x0) && (ctxt->record_info != 0)) {
      pxVar4 = ctxt->input;
      local_58.end_pos = (unsigned_long)(pxVar4->cur + (pxVar4->consumed - (long)pxVar4->base));
      local_58.end_line = (unsigned_long)pxVar4->line;
      local_58.node = p_Var5;
      xmlParserAddNodeInfo(ctxt,&local_58);
    }
  }
  else {
    pxVar4 = ctxt->input;
    pxVar6 = pxVar4->cur;
    if (xVar3 == XML_TYPE_XML) {
      if (*pxVar6 != '>') {
        xmlFatalErrMsgStrIntStr
                  (ctxt,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s line %d\n",value,
                   iVar11,(xmlChar *)0x0);
        nodePop(ctxt);
        namePop(ctxt);
        iVar11 = ctxt->spaceNr;
        if (0 < (long)iVar11) {
          ctxt->spaceNr = iVar11 + -1;
          piVar1 = ctxt->spaceTab + (long)iVar11 + -2;
          piVar9 = ctxt->spaceTab;
          if (iVar11 != 1) {
            piVar9 = piVar1;
          }
          ctxt->space = piVar9;
          piVar1[1] = -1;
        }
        iVar12 = ctxt->nsNr - iVar12;
        if (iVar12 != 0) {
          nsPop(ctxt,iVar12);
        }
        goto LAB_0016706d;
      }
    }
    else {
      if (*pxVar6 != '{') {
        ctxt->curly = 0;
        return 0;
      }
      ctxt->curly = 1;
    }
    pxVar4->col = pxVar4->col + 1;
    pxVar4->cur = pxVar6 + 1;
    iVar10 = 0;
    if (pxVar6[1] == '\0') {
      xmlParserInputGrow(pxVar4,0xfa);
      iVar10 = 0;
    }
  }
  return iVar10;
}

Assistant:

static int
xmlParseElementStart(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *prefix = NULL;
    const xmlChar *URI = NULL;
    xmlParserNodeInfo node_info;
    int line, tlen = 0;
    xmlNodePtr ret;
    int nsNr = ctxt->nsNr;

    DEBUG_ENTER(("xmlParseElementStart(%s);\n", dbgCtxt(ctxt)));

    if (((unsigned int) ctxt->nameNr > xmlParserMaxDepth) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
	xmlFatalErrMsgInt(ctxt, XML_ERR_INTERNAL_ERROR,
		 "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
			  xmlParserMaxDepth);
	xmlHaltParser(ctxt);
	RETURN_INT(-1);
    }

    /* Capture start position */
    if (ctxt->record_info) {
        node_info.begin_pos = ctxt->input->consumed +
                          (CUR_PTR - ctxt->input->base);
	node_info.begin_line = ctxt->input->line;
    }

    /* TODO FOR SML: Move ctxt->curly to one of these spaces, to avoid having to save it manually? */
    if (ctxt->spaceNr == 0)
	spacePush(ctxt, -1);
    else if (*ctxt->space == -2)
	spacePush(ctxt, -1);
    else
	spacePush(ctxt, *ctxt->space);

    line = ctxt->input->line;
#ifdef LIBXML_SAX1_ENABLED
    if (ctxt->sax2)
#endif /* LIBXML_SAX1_ENABLED */
        name = xmlParseStartTag2(ctxt, &prefix, &URI, &tlen);
#ifdef LIBXML_SAX1_ENABLED
    else
	name = xmlParseStartTag(ctxt);
#endif /* LIBXML_SAX1_ENABLED */
    if (ctxt->instate == XML_PARSER_EOF)
	RETURN_INT(-1);
    if (name == NULL) {
	spacePop(ctxt);
        RETURN_INT(-1);
    }
    if (ctxt->sax2)
        nameNsPush(ctxt, name, prefix, URI, ctxt->nsNr - nsNr);
#ifdef LIBXML_SAX1_ENABLED
    else
        namePush(ctxt, name);
#endif /* LIBXML_SAX1_ENABLED */
    ret = ctxt->node;

#ifdef LIBXML_VALID_ENABLED
    /*
     * [ VC: Root Element Type ]
     * The Name in the document type declaration must match the element
     * type of the root element.
     */
    if (ctxt->validate && ctxt->wellFormed && ctxt->myDoc &&
        ctxt->node && (ctxt->node == ctxt->myDoc->children))
        ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check for an Empty Element.
     */
    if (   (ISXML && (RAW == '/') && (NXT(1) == '>'))
    	|| (ISSML && ((RAW == '\n') || (RAW == ';') || (RAW == '}')))) {
        if (ISXML) {						/* XML */
            SKIP(2);
        } else {						/* SML */
            if (RAW == ';') { /* But do not skip '}', which can't belong to an empty element */
		SKIP(1);
            }
        }
	if (ctxt->sax2) {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElementNs != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElementNs(ctxt->userData, name, prefix, URI);
#ifdef LIBXML_SAX1_ENABLED
	} else {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElement(ctxt->userData, name);
#endif /* LIBXML_SAX1_ENABLED */
	}
	namePop(ctxt);
	spacePop(ctxt);
	if (nsNr != ctxt->nsNr)
	    nsPop(ctxt, ctxt->nsNr - nsNr);
	if ( ret != NULL && ctxt->record_info ) {
	   node_info.end_pos = ctxt->input->consumed +
			      (CUR_PTR - ctxt->input->base);
	   node_info.end_line = ctxt->input->line;
	   node_info.node = ret;
	   xmlParserAddNodeInfo(ctxt, &node_info);
	}
	RETURN_INT_COMMENT(1, ("xmlParseElement. ctxt = %s;\n", dbgCtxt(ctxt)));
    }
    if (ISXML) {						/* XML */
	if (RAW == '>') {
	    NEXT1;
	} else {
	    xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_GT_REQUIRED,
			 "Couldn't find end of Start Tag %s line %d\n",
				    name, line, NULL);

	    /*
	     * end of parsing of this node.
	     */
	    nodePop(ctxt);
	    namePop(ctxt);
	    spacePop(ctxt);
	    if (nsNr != ctxt->nsNr)
		nsPop(ctxt, ctxt->nsNr - nsNr);

	    /*
	     * Capture end position and add node
	     */
	    if ( ret != NULL && ctxt->record_info ) {
	       node_info.end_pos = ctxt->input->consumed +
				  (CUR_PTR - ctxt->input->base);
	       node_info.end_line = ctxt->input->line;
	       node_info.node = ret;
	       xmlParserAddNodeInfo(ctxt, &node_info);
	    }
	RETURN_INT_COMMENT(-1, ("xmlParseElement. ctxt = %s;\n", dbgCtxt(ctxt)));
	}
    } else {							/* SML */
	if (RAW == '{') {
	    ctxt->curly = 1;
	    NEXT1;
	} else {
	    ctxt->curly = 0;
	}
	DEBUG_PRINTF(("curly = %d;\n", ctxt->curly));
    	/* TODO FOR SML: Is there any test to do here to detect and report invalid tag definitions? */
    }

    RETURN_INT(0);
}